

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O0

void tt_face_free_colr(TT_Face face)

{
  FT_Stream stream_00;
  FT_Memory memory_00;
  void *P;
  void *pvVar1;
  FT_Service_MultiMasters mm;
  Colr *colr;
  FT_Memory memory;
  FT_Stream stream;
  TT_Face face_local;
  
  stream_00 = (face->root).stream;
  memory_00 = (face->root).memory;
  P = face->colr;
  if (P != (void *)0x0) {
    pvVar1 = face->mm;
    (**(code **)((long)pvVar1 + 0x70))(face,(long)P + 0x68);
    (**(code **)((long)pvVar1 + 0x68))(face,(long)P + 0x48);
    FT_Stream_ReleaseFrame(stream_00,(FT_Byte **)((long)P + 0x80));
    ft_mem_free(memory_00,P);
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  tt_face_free_colr( TT_Face  face )
  {
    FT_Stream  stream = face->root.stream;
    FT_Memory  memory = face->root.memory;

    Colr*  colr = (Colr*)face->colr;


    if ( colr )
    {
#ifdef TT_CONFIG_OPTION_GX_VAR_SUPPORT
      {
        FT_Service_MultiMasters  mm = (FT_Service_MultiMasters)face->mm;


        mm->done_delta_set_idx_map( FT_FACE( face ),
                                    &colr->delta_set_idx_map );
        mm->done_item_var_store( FT_FACE( face ),
                                 &colr->var_store );
      }
#endif
      FT_FRAME_RELEASE( colr->table );
      FT_FREE( colr );
    }
  }